

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

void Terminate(PaUtilHostApiRepresentation *hostApi)

{
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaUtilHostApiRepresentation *hostApi_local;
  
  if (hostApi != (PaUtilHostApiRepresentation *)0x0) {
    if (hostApi[3].Terminate != (_func_void_PaUtilHostApiRepresentation_ptr *)0x0) {
      PaUtil_FreeAllAllocations((PaUtilAllocationGroup *)hostApi[3].Terminate);
      PaUtil_DestroyAllocationGroup((PaUtilAllocationGroup *)hostApi[3].Terminate);
    }
    PaUtil_FreeMemory(hostApi);
    (*(code *)alsa_snd_config_update_free_global)();
    PaAlsa_CloseLibrary();
    return;
  }
  __assert_fail("hostApi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x329,"void Terminate(struct PaUtilHostApiRepresentation *)");
}

Assistant:

static void Terminate( struct PaUtilHostApiRepresentation *hostApi )
{
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;

    /*
        IMPLEMENT ME:
            - clean up any resources not handled by the allocation group
    */

    if( skeletonHostApi->allocations )
    {
        PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
        PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
    }

    PaUtil_FreeMemory( skeletonHostApi );
}